

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_decoder.cpp
# Opt level: O1

void __thiscall
duckdb::DictionaryDecoder::InitializeDictionary
          (DictionaryDecoder *this,idx_t new_dictionary_size,
          optional_ptr<const_duckdb::TableFilter,_true> filter,
          optional_ptr<duckdb::TableFilterState,_true> filter_state,bool has_defines)

{
  unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *this_00;
  SelectionVector *pSVar1;
  ValidityMask *pVVar2;
  ulong uVar3;
  _Head_base<0UL,_bool_*,_false> _Var4;
  ParquetColumnSchema *pPVar5;
  _Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_> __ptr;
  ParquetReader *pPVar6;
  pointer pcVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  ColumnReader *pCVar9;
  idx_t iVar10;
  byte bVar11;
  sel_t *psVar12;
  optional_ptr<const_duckdb::TableFilter,_true> oVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  char cVar16;
  bool bVar17;
  pointer pVVar18;
  _Head_base<0UL,_duckdb::Vector_*,_false> this_01;
  long *plVar19;
  type pVVar20;
  TemplatedValidityData<unsigned_long> *pTVar21;
  _Head_base<0UL,_bool_*,_false> __s;
  long *plVar22;
  ulong *puVar23;
  ulong uVar24;
  char cVar25;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var26;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var27;
  idx_t iVar28;
  idx_t iVar29;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var30;
  SelectionVector dict_sel;
  string __str_1;
  UnifiedVectorFormat vdata;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  SelectionVector local_108;
  long lStack_f0;
  optional_ptr<duckdb::TableFilterState,_true> local_e8;
  optional_ptr<const_duckdb::TableFilter,_true> local_e0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **local_d8;
  uint local_d0;
  undefined4 uStack_cc;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c8 [2];
  undefined1 local_b8 [24];
  element_type *peStack_a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  uVar3 = this->dictionary_size;
  _Var4._M_head_impl =
       (this->filter_result).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
       super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
       super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
       super__Head_base<0UL,_bool_*,_false>._M_head_impl;
  this->dictionary_size = new_dictionary_size;
  (this->filter_result).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
  super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
  super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.super__Head_base<0UL,_bool_*,_false>.
  _M_head_impl = (bool *)0x0;
  local_e8.ptr = filter_state.ptr;
  local_e0.ptr = filter.ptr;
  if (_Var4._M_head_impl != (bool *)0x0) {
    operator_delete__(_Var4._M_head_impl);
  }
  this->filter_count = 0;
  this->can_have_nulls = has_defines;
  this_00 = &this->dictionary;
  if ((this->dictionary).super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t
      .super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
      super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl == (Vector *)0x0) {
    iVar10 = this->dictionary_size;
    pPVar5 = this->reader->column_schema;
    this_01._M_head_impl = (Vector *)operator_new(0x68);
    LogicalType::LogicalType((LogicalType *)local_b8,&pPVar5->type);
    Vector::Vector(this_01._M_head_impl,(LogicalType *)local_b8,iVar10 + 1);
    local_108.sel_vector = (sel_t *)this_01._M_head_impl;
    LogicalType::~LogicalType((LogicalType *)local_b8);
    psVar12 = local_108.sel_vector;
    local_108.sel_vector = (sel_t *)0x0;
    __ptr.super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl =
         (this_00->super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>)._M_t.
         super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
         super__Head_base<0UL,_duckdb::Vector_*,_false>;
    (this_00->super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
    super__Head_base<0UL,_duckdb::Vector_*,_false> =
         (_Head_base<0UL,_duckdb::Vector_*,_false>)psVar12;
    if (__ptr.super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl != (Vector *)0x0) {
      ::std::default_delete<duckdb::Vector>::operator()
                ((default_delete<duckdb::Vector> *)this_00,
                 (Vector *)__ptr.super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl);
    }
    if ((Vector *)local_108.sel_vector != (Vector *)0x0) {
      ::std::default_delete<duckdb::Vector>::operator()
                ((default_delete<duckdb::Vector> *)&local_108,(Vector *)local_108.sel_vector);
    }
  }
  else if (uVar3 < this->dictionary_size) {
    pVVar18 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                        (this_00);
    Vector::Resize(pVVar18,uVar3,this->dictionary_size + 1);
  }
  pPVar6 = this->reader->reader;
  pcVar7 = (pPVar6->super_BaseFileReader).file.path._M_dataplus._M_p;
  local_50[0] = local_40;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar7,
             pcVar7 + (pPVar6->super_BaseFileReader).file.path._M_string_length);
  ::std::__cxx11::string::append((char *)local_50);
  plVar19 = (long *)::std::__cxx11::string::_M_append
                              ((char *)local_50,
                               (ulong)(this->reader->column_schema->name)._M_dataplus._M_p);
  local_70 = &local_60;
  plVar22 = plVar19 + 2;
  if ((long *)*plVar19 == plVar22) {
    local_60 = *plVar22;
    lStack_58 = plVar19[3];
  }
  else {
    local_60 = *plVar22;
    local_70 = (long *)*plVar19;
  }
  local_68 = plVar19[1];
  *plVar19 = (long)plVar22;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  plVar19 = (long *)::std::__cxx11::string::append((char *)&local_70);
  p_Var30 = &local_108.selection_data.internal.
             super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  puVar23 = (ulong *)(plVar19 + 2);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)*plVar19 ==
      (__shared_count<(__gnu_cxx::_Lock_policy)2> *)puVar23) {
    local_108.selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*puVar23;
    lStack_f0 = plVar19[3];
    local_108.sel_vector = (sel_t *)p_Var30;
  }
  else {
    local_108.selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*puVar23;
    local_108.sel_vector = (sel_t *)*plVar19;
  }
  local_108.selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)plVar19[1];
  *plVar19 = (long)puVar23;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  uVar3 = this->reader->chunk_read_offset;
  cVar25 = '\x01';
  if (9 < uVar3) {
    uVar24 = uVar3;
    cVar16 = '\x04';
    do {
      cVar25 = cVar16;
      if (uVar24 < 100) {
        cVar25 = cVar25 + -2;
        goto LAB_0114d77e;
      }
      if (uVar24 < 1000) {
        cVar25 = cVar25 + -1;
        goto LAB_0114d77e;
      }
      if (uVar24 < 10000) goto LAB_0114d77e;
      bVar17 = 99999 < uVar24;
      uVar24 = uVar24 / 10000;
      cVar16 = cVar25 + '\x04';
    } while (bVar17);
    cVar25 = cVar25 + '\x01';
  }
LAB_0114d77e:
  local_d8 = local_c8;
  ::std::__cxx11::string::_M_construct((ulong)&local_d8,cVar25);
  ::std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_d8,local_d0,uVar3);
  p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((long)&((local_108.selection_data.internal.
                     super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   owned_data).allocator.ptr + CONCAT44(uStack_cc,local_d0));
  _Var26._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_108.sel_vector != p_Var30) {
    _Var26._M_pi = local_108.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi;
  }
  if (_Var26._M_pi < p_Var8) {
    p_Var27 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
    if (local_d8 != local_c8) {
      p_Var27 = local_c8[0];
    }
    if (p_Var8 <= p_Var27) {
      plVar19 = (long *)::std::__cxx11::string::replace
                                  ((ulong)&local_d8,0,(char *)0x0,(ulong)local_108.sel_vector);
      goto LAB_0114d803;
    }
  }
  plVar19 = (long *)::std::__cxx11::string::_M_append((char *)&local_108,(ulong)local_d8);
LAB_0114d803:
  local_b8._0_8_ = local_b8 + 0x10;
  pSVar1 = (SelectionVector *)(plVar19 + 2);
  if ((SelectionVector *)*plVar19 == pSVar1) {
    local_b8._16_8_ =
         (((unsafe_unique_array<unsigned_long> *)&pSVar1->sel_vector)->
         super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
    peStack_a0 = (element_type *)plVar19[3];
  }
  else {
    local_b8._16_8_ =
         (((unsafe_unique_array<unsigned_long> *)&pSVar1->sel_vector)->
         super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
    local_b8._0_8_ = (SelectionVector *)*plVar19;
  }
  local_b8._8_8_ = plVar19[1];
  *plVar19 = (long)pSVar1;
  plVar19[1] = 0;
  *(undefined1 *)
   &(((unsafe_unique_array<unsigned_long> *)&pSVar1->sel_vector)->
    super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
    super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t = 0;
  ::std::__cxx11::string::operator=((string *)&this->dictionary_id,(string *)local_b8);
  if ((SelectionVector *)local_b8._0_8_ != (SelectionVector *)(local_b8 + 0x10)) {
    operator_delete((void *)local_b8._0_8_);
  }
  if (local_d8 != local_c8) {
    operator_delete(local_d8);
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_108.sel_vector != p_Var30) {
    operator_delete(local_108.sel_vector);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  pVVar20 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                      (this_00);
  FlatVector::VerifyFlatVector(pVVar20);
  p_Var30 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this->dictionary_size + 1);
  (pVVar20->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
       (unsigned_long *)0x0;
  (pVVar20->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  p_Var8 = (pVVar20->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (pVVar20->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
  }
  (pVVar20->validity).super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)p_Var30;
  if (this->can_have_nulls == true) {
    pVVar2 = &pVVar20->validity;
    uVar3 = this->dictionary_size;
    if ((pVVar2->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0)
    {
      local_108.sel_vector = (sel_t *)p_Var30;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                ((duckdb *)local_b8,(unsigned_long *)&local_108);
      uVar15 = local_b8._8_8_;
      uVar14 = local_b8._0_8_;
      local_b8._0_8_ = (SelectionVector *)0x0;
      local_b8._8_8_ = (element_type *)0x0;
      p_Var8 = (pVVar20->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal
               .
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
      (pVVar20->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)uVar14;
      (pVVar20->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar15;
      if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
      }
      if ((element_type *)local_b8._8_8_ != (element_type *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
      }
      pTVar21 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                          (&(pVVar20->validity).super_TemplatedValidityMask<unsigned_long>.
                            validity_data);
      (pVVar2->super_TemplatedValidityMask<unsigned_long>).validity_mask =
           (unsigned_long *)
           (pTVar21->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
    }
    bVar11 = (byte)uVar3 & 0x3f;
    puVar23 = (pVVar2->super_TemplatedValidityMask<unsigned_long>).validity_mask + (uVar3 >> 6);
    *puVar23 = *puVar23 & (-2L << bVar11 | 0xfffffffffffffffeU >> 0x40 - bVar11);
  }
  pCVar9 = this->reader;
  iVar10 = this->dictionary_size;
  pVVar20 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                      (this_00);
  (*pCVar9->_vptr_ColumnReader[0xf])(pCVar9,&pCVar9->block,0,iVar10,0,pVVar20);
  if (local_e0.ptr != (TableFilter *)0x0) {
    optional_ptr<const_duckdb::TableFilter,_true>::CheckValid(&local_e0);
    oVar13.ptr = local_e0.ptr;
    optional_ptr<duckdb::TableFilterState,_true>::CheckValid(&local_e8);
    if (this->dictionary_size != 0) {
      bVar17 = DictionarySupportsFilter(this,oVar13.ptr,local_e8.ptr);
      if (bVar17) {
        uVar3 = this->dictionary_size;
        __s._M_head_impl = (bool *)operator_new__(uVar3);
        switchD_005700f1::default(__s._M_head_impl,0,uVar3);
        _Var4._M_head_impl =
             (this->filter_result).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
             super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
             super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
             super__Head_base<0UL,_bool_*,_false>._M_head_impl;
        (this->filter_result).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
        super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
        super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
        super__Head_base<0UL,_bool_*,_false>._M_head_impl = __s._M_head_impl;
        if (_Var4._M_head_impl != (bool *)0x0) {
          operator_delete__(_Var4._M_head_impl);
        }
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
        pVVar18 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                            (this_00);
        Vector::ToUnifiedFormat(pVVar18,this->dictionary_size,(UnifiedVectorFormat *)local_b8);
        local_108.sel_vector = (sel_t *)0x0;
        local_108.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_108.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        this->filter_count = this->dictionary_size;
        pVVar20 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                            (this_00);
        optional_ptr<const_duckdb::TableFilter,_true>::CheckValid(&local_e0);
        oVar13.ptr = local_e0.ptr;
        optional_ptr<duckdb::TableFilterState,_true>::CheckValid(&local_e8);
        ColumnSegment::FilterSelection
                  (&local_108,pVVar20,(UnifiedVectorFormat *)local_b8,oVar13.ptr,local_e8.ptr,
                   this->dictionary_size,&this->filter_count);
        iVar10 = this->filter_count;
        if (iVar10 != 0) {
          _Var4._M_head_impl =
               (this->filter_result).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
               super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
               super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
               super__Head_base<0UL,_bool_*,_false>._M_head_impl;
          iVar28 = 0;
          do {
            iVar29 = iVar28;
            if (local_108.sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)local_108.sel_vector[iVar28];
            }
            _Var4._M_head_impl[iVar29] = true;
            iVar28 = iVar28 + 1;
          } while (iVar10 != iVar28);
        }
        if (local_108.selection_data.internal.
            super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_108.selection_data.internal.
                     super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_78._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78._M_pi);
        }
        if (local_98._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98._M_pi);
        }
      }
    }
  }
  return;
}

Assistant:

void DictionaryDecoder::InitializeDictionary(idx_t new_dictionary_size, optional_ptr<const TableFilter> filter,
                                             optional_ptr<TableFilterState> filter_state, bool has_defines) {
	auto old_dict_size = dictionary_size;
	dictionary_size = new_dictionary_size;
	filter_result.reset();
	filter_count = 0;
	can_have_nulls = has_defines;
	// we use the first value in the dictionary to keep a NULL
	if (!dictionary) {
		dictionary = make_uniq<Vector>(reader.Type(), dictionary_size + 1);
	} else if (dictionary_size > old_dict_size) {
		dictionary->Resize(old_dict_size, dictionary_size + 1);
	}
	dictionary_id =
	    reader.reader.GetFileName() + "_" + reader.Schema().name + "_" + std::to_string(reader.chunk_read_offset);
	// we use the last entry as a NULL, dictionary vectors don't have a separate validity mask
	auto &dict_validity = FlatVector::Validity(*dictionary);
	dict_validity.Reset(dictionary_size + 1);
	if (can_have_nulls) {
		dict_validity.SetInvalid(dictionary_size);
	}
	reader.Plain(reader.block, nullptr, dictionary_size, 0, *dictionary);

	if (filter && CanFilter(*filter, *filter_state)) {
		// no filter result yet - apply filter to the dictionary
		// initialize the filter result - setting everything to false
		filter_result = make_unsafe_uniq_array<bool>(dictionary_size);

		// apply the filter
		UnifiedVectorFormat vdata;
		dictionary->ToUnifiedFormat(dictionary_size, vdata);
		SelectionVector dict_sel;
		filter_count = dictionary_size;
		ColumnSegment::FilterSelection(dict_sel, *dictionary, vdata, *filter, *filter_state, dictionary_size,
		                               filter_count);

		// now set all matching tuples to true
		for (idx_t i = 0; i < filter_count; i++) {
			auto idx = dict_sel.get_index(i);
			filter_result[idx] = true;
		}
	}
}